

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_shape_effect_msg(parser *p)

{
  long *plVar1;
  void *pvVar2;
  long *plVar3;
  char *s2;
  char *pcVar4;
  parser_error pVar5;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar5 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    plVar1 = *(long **)((long)pvVar2 + 0x100);
    pVar5 = PARSE_ERROR_NONE;
    if (*(long **)((long)pvVar2 + 0x100) != (long *)0x0) {
      do {
        plVar3 = plVar1;
        plVar1 = (long *)*plVar3;
      } while ((long *)*plVar3 != (long *)0x0);
      pcVar4 = (char *)plVar3[6];
      s2 = parser_getstr(p,"text");
      pcVar4 = string_append(pcVar4,s2);
      plVar3[6] = (long)pcVar4;
      pVar5 = PARSE_ERROR_NONE;
    }
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_shape_effect_msg(struct parser *p) {
	struct player_shape *shape = parser_priv(p);
	struct effect *effect;

	if (!shape) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* If there is no effect, assume that this is human and not parser error. */
	effect = shape->effect;
	if (effect == NULL) {
		return PARSE_ERROR_NONE;
	}
	while (effect->next) effect = effect->next;

	effect->msg = string_append(effect->msg, parser_getstr(p, "text"));
	return PARSE_ERROR_NONE;
}